

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# paramdict.cpp
# Opt level: O2

void __thiscall ncnn::ParamDict::clear(ParamDict *this)

{
  ParamDictPrivate *pPVar1;
  long lVar2;
  Mat local_68;
  
  for (lVar2 = 8; lVar2 != 0xa08; lVar2 = lVar2 + 0x50) {
    pPVar1 = this->d;
    *(undefined4 *)((long)pPVar1->params + lVar2 + -8) = 0;
    local_68.cstep = 0;
    local_68.data = (void *)0x0;
    local_68.refcount._0_4_ = 0;
    local_68.refcount._4_4_ = 0;
    local_68.elemsize._0_4_ = 0;
    local_68._20_8_ = 0;
    local_68.h = 0;
    local_68.d = 0;
    local_68.c = 0;
    local_68.allocator = (Allocator *)0x0;
    local_68.dims = 0;
    local_68.w = 0;
    Mat::operator=((Mat *)((long)&pPVar1->params[0].type + lVar2),&local_68);
    Mat::~Mat(&local_68);
  }
  return;
}

Assistant:

void ParamDict::clear()
{
    for (int i = 0; i < NCNN_MAX_PARAM_COUNT; i++)
    {
        d->params[i].type = 0;
        d->params[i].v = Mat();
    }
}